

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O0

double __thiscall
brotli::ZopfliCostModel::GetCommandCost
          (ZopfliCostModel *this,size_t dist_code,size_t length_code,size_t insert_length)

{
  uint uVar1;
  const_reference pvVar2;
  double local_40;
  double result;
  uint32_t distnumextra;
  uint32_t distextra;
  uint16_t dist_symbol;
  uint16_t cmdcode;
  uint16_t copycode;
  uint16_t inscode;
  size_t insert_length_local;
  size_t length_code_local;
  size_t dist_code_local;
  ZopfliCostModel *this_local;
  
  _dist_symbol = insert_length;
  insert_length_local = length_code;
  length_code_local = dist_code;
  dist_code_local = (size_t)this;
  distextra._2_2_ = GetInsertLengthCode(insert_length);
  distextra._0_2_ = GetCopyLengthCode(insert_length_local);
  distnumextra._2_2_ =
       CombineLengthCodes(distextra._2_2_,(uint16_t)distextra,length_code_local == 0);
  PrefixEncodeCopyDistance
            (length_code_local,0,0,(uint16_t *)&distnumextra,(uint32_t *)((long)&result + 4));
  result._0_4_ = (uint)result._7_1_;
  uVar1 = *(int *)(kInsExtra + (ulong)distextra._2_2_ * 4) +
          *(int *)(kCopyExtra + (ulong)(uint16_t)distextra * 4) + result._0_4_;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&this->cost_cmd_,(ulong)distnumextra._2_2_);
  local_40 = *pvVar2 + (double)uVar1;
  if (0x7f < distnumextra._2_2_) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->cost_dist_,(ulong)(ushort)distnumextra);
    local_40 = *pvVar2 + local_40;
  }
  return local_40;
}

Assistant:

double GetCommandCost(
      size_t dist_code, size_t length_code, size_t insert_length) const {
    uint16_t inscode = GetInsertLengthCode(insert_length);
    uint16_t copycode = GetCopyLengthCode(length_code);
    uint16_t cmdcode = CombineLengthCodes(inscode, copycode, dist_code == 0);
    uint16_t dist_symbol;
    uint32_t distextra;
    PrefixEncodeCopyDistance(dist_code, 0, 0, &dist_symbol, &distextra);
    uint32_t distnumextra = distextra >> 24;

    double result =  static_cast<double>(
        kInsExtra[inscode] + kCopyExtra[copycode] + distnumextra);
    result += cost_cmd_[cmdcode];
    if (cmdcode >= 128) result += cost_dist_[dist_symbol];
    return result;
  }